

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,SimdStoreLaneExpr *expr)

{
  Module *pMVar1;
  Enum EVar2;
  Index IVar3;
  const_reference ppMVar4;
  unsigned_long *u;
  Newline local_61;
  Type local_60;
  StackVar local_58;
  Type local_4c;
  StackVar local_44;
  ExternalInstancePtr local_38;
  value_type local_28;
  Memory *memory;
  char *func;
  SimdStoreLaneExpr *expr_local;
  CWriter *this_local;
  
  memory = (Memory *)0x0;
  func = (char *)expr;
  expr_local = (SimdStoreLaneExpr *)this;
  EVar2 = Opcode::operator_cast_to_Enum(&expr->opcode);
  switch(EVar2) {
  case V128Store8Lane:
    memory = (Memory *)anon_var_dwarf_332320;
    break;
  case V128Store16Lane:
    memory = (Memory *)anon_var_dwarf_33232c;
    break;
  case V128Store32Lane:
    memory = (Memory *)anon_var_dwarf_332338;
    break;
  case V128Store64Lane:
    memory = (Memory *)anon_var_dwarf_332344;
    break;
  default:
    abort();
  }
  pMVar1 = this->module_;
  IVar3 = Module::GetMemoryIndex(this->module_,(Var *)(func + 0x40));
  ppMVar4 = std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::operator[]
                      (&pMVar1->memories,(ulong)IVar3);
  local_28 = *ppMVar4;
  u = (unsigned_long *)(func + 0xa0);
  ExternalInstancePtr::GlobalName(&local_38,Memory,&local_28->name);
  Type::Type(&local_4c,Any);
  StackVar::StackVar(&local_44,1,local_4c);
  (anonymous_namespace)::CWriter::
  Write<char_const*&,unsigned_long_const&,char_const(&)[2],wabt::(anonymous_namespace)::ExternalInstancePtr,char_const(&)[9],wabt::(anonymous_namespace)::StackVar,char_const(&)[2]>
            ((CWriter *)this,(char **)&memory,u,(char (*) [2])0x37d6a1,&local_38,
             (char (*) [9])", (u64)(",&local_44,(char (*) [2])0x371d65);
  if (*(long *)(func + 0x98) != 0) {
    (anonymous_namespace)::CWriter::Write<char_const(&)[4],unsigned_long_const&,char_const(&)[2]>
              ((CWriter *)this,(char (*) [4])" + ",(unsigned_long *)(func + 0x98),
               (char (*) [2])0x375638);
  }
  Type::Type(&local_60,Any);
  StackVar::StackVar(&local_58,0,local_60);
  (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::StackVar>
            ((CWriter *)this,(char (*) [3])0x37f5cf,&local_58);
  (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [3])0x37d78e,&local_61);
  DropTypes(this,2);
  return;
}

Assistant:

void CWriter::Write(const SimdStoreLaneExpr& expr) {
  const char* func = nullptr;
  // clang-format off
  switch (expr.opcode) {
    case Opcode::V128Store8Lane: func = "v128_store8_lane"; break;
    case Opcode::V128Store16Lane: func = "v128_store16_lane"; break;
    case Opcode::V128Store32Lane: func = "v128_store32_lane"; break;
    case Opcode::V128Store64Lane: func = "v128_store64_lane"; break;
    default:
      WABT_UNREACHABLE;
  }
  // clang-format on
  Memory* memory = module_->memories[module_->GetMemoryIndex(expr.memidx)];

  Write(func, expr.val, "(",
        ExternalInstancePtr(ModuleFieldType::Memory, memory->name), ", (u64)(",
        StackVar(1), ")");

  if (expr.offset != 0)
    Write(" + ", expr.offset, "u");
  Write(", ", StackVar(0));
  Write(");", Newline());

  DropTypes(2);
}